

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSweeper.c
# Opt level: O1

void Gia_SweeperLogicDump(Gia_Man_t *p,Vec_Int_t *vProbeIds,int fDumpConds,char *pFileName)

{
  Vec_Int_t *vProbeIds_00;
  Gia_Man_t *pNew;
  Gia_Man_t *pTwo;
  
  pNew = Gia_SweeperExtractUserLogic(p,vProbeIds,(Vec_Ptr_t *)0x0,(Vec_Ptr_t *)0x0);
  vProbeIds_00 = *(Vec_Int_t **)((long)p->pData + 0x18);
  printf("Dumping logic cones");
  if ((fDumpConds != 0) && (0 < vProbeIds_00->nSize)) {
    pTwo = Gia_SweeperExtractUserLogic(p,vProbeIds_00,(Vec_Ptr_t *)0x0,(Vec_Ptr_t *)0x0);
    Gia_ManDupAppendShare(pNew,pTwo);
    pNew->nConstrs = pTwo->vCos->nSize - pTwo->nRegs;
    Gia_ManHashStop(pNew);
    Gia_ManStop(pTwo);
    printf(" and conditions");
  }
  Gia_AigerWrite(pNew,pFileName,0,0);
  Gia_ManStop(pNew);
  printf(" into file \"%s\".\n",pFileName);
  return;
}

Assistant:

void Gia_SweeperLogicDump( Gia_Man_t * p, Vec_Int_t * vProbeIds, int fDumpConds, char * pFileName )
{
    Gia_Man_t * pGiaOuts = Gia_SweeperExtractUserLogic( p, vProbeIds, NULL, NULL );
    Vec_Int_t * vProbeConds = Gia_SweeperCondVector( p );
    printf( "Dumping logic cones" );
    if ( fDumpConds && Vec_IntSize(vProbeConds) > 0 )
    {
        Gia_Man_t * pGiaCond = Gia_SweeperExtractUserLogic( p, vProbeConds, NULL, NULL );
        Gia_ManDupAppendShare( pGiaOuts, pGiaCond );
        pGiaOuts->nConstrs = Gia_ManPoNum(pGiaCond);
        Gia_ManHashStop( pGiaOuts );
        Gia_ManStop( pGiaCond );
        printf( " and conditions" );
    }
    Gia_AigerWrite( pGiaOuts, pFileName, 0, 0 );
    Gia_ManStop( pGiaOuts );
    printf( " into file \"%s\".\n", pFileName );
}